

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O0

uint32_t corrupt_action(warm_cb *data,uint32_t action,int ec_type)

{
  int in_EDX;
  uint32_t in_ESI;
  long in_RDI;
  float fVar1;
  float randf;
  uint32_t cor_action;
  uint32_t cor_type;
  float cor_prob;
  warm_cb *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int local_18;
  float local_14;
  
  local_14 = 0.0;
  local_18 = 1;
  if (in_EDX == 1) {
    local_14 = *(float *)(in_RDI + 0x8c);
    local_18 = *(int *)(in_RDI + 0x88);
  }
  fVar1 = merand48((uint64_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (fVar1 < local_14) {
    if (local_18 == 1) {
      in_ESI = generate_uar_action(in_stack_ffffffffffffffd8);
    }
    else if (local_18 == 3) {
      in_ESI = *(uint32_t *)(in_RDI + 0x9c);
    }
    else {
      in_ESI = in_ESI % *(uint *)(in_RDI + 0xa8) + 1;
    }
  }
  return in_ESI;
}

Assistant:

uint32_t corrupt_action(warm_cb& data, uint32_t action, int ec_type)
{
	float cor_prob=0.;
	uint32_t cor_type=UAR;
	uint32_t cor_action;

	if (ec_type == WARM_START)
	{
		cor_prob = data.cor_prob_ws;
		cor_type = data.cor_type_ws;
	}

	float randf = merand48(data.all->random_state);
	if (randf < cor_prob)
	{
		if (cor_type == UAR)
			cor_action = generate_uar_action(data);
		else if (cor_type == OVERWRITE)
			cor_action = data.overwrite_label;
		else
			cor_action = (action % data.num_actions) + 1;
	}
	else
		cor_action = action;
	return cor_action;
}